

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalCreateDummyThread
                    (CPalThread *pThread,LPSECURITY_ATTRIBUTES lpThreadAttributes,
                    CPalThread **ppDummyThread,HANDLE *phThread)

{
  bool bVar1;
  PAL_ERROR PVar2;
  CPalThread *this;
  undefined8 uStack_70;
  CObjectAttributes oa;
  IDataLock *pDataLock;
  CThreadProcessLocalData *pLocalData;
  long *local_40;
  IPalObject *pobjThreadRegistered;
  IPalObject *pobjThread;
  
  bVar1 = false;
  pobjThreadRegistered = (IPalObject *)0x0;
  local_40 = (long *)0x0;
  uStack_70 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName._8_8_ = lpThreadAttributes;
  this = AllocTHREAD();
  if (this == (CPalThread *)0x0) {
    PVar2 = 0xe;
  }
  else {
    this->m_fIsDummy = true;
    pLocalData = (CThreadProcessLocalData *)ppDummyThread;
    PVar2 = (**(code **)*g_pObjectManager)
                      (g_pObjectManager,pThread,&otThread,&uStack_70,&pobjThreadRegistered);
    if ((PVar2 == 0) &&
       (PVar2 = (*pobjThreadRegistered->_vptr_IPalObject[3])
                          (pobjThreadRegistered,pThread,1,&oa.pSecurityAttributes,&pDataLock),
       PVar2 == 0)) {
      pDataLock->_vptr_IDataLock = (_func_int **)this;
      (*(code *)**(undefined8 **)oa.pSecurityAttributes)(oa.pSecurityAttributes,pThread,1);
      PVar2 = (**(code **)(*g_pObjectManager + 8))
                        (g_pObjectManager,pThread,pobjThreadRegistered,&aotThread,0,phThread,
                         &local_40);
      pobjThreadRegistered = (IPalObject *)0x0;
      bVar1 = true;
      if (PVar2 == 0) {
        pLocalData->pThread = this;
        PVar2 = 0;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x40))(local_40,pThread);
  }
  if (pobjThreadRegistered != (IPalObject *)0x0) {
    (*pobjThreadRegistered->_vptr_IPalObject[8])(pobjThreadRegistered,pThread);
  }
  if ((PVar2 != 0 && !bVar1) && this != (CPalThread *)0x0) {
    CPalThread::ReleaseThreadReference(this);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateDummyThread(
    CPalThread *pThread,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    CPalThread **ppDummyThread,
    HANDLE *phThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pDummyThread = NULL;
    IPalObject *pobjThread = NULL;
    IPalObject *pobjThreadRegistered = NULL;
    IDataLock *pDataLock;
    CThreadProcessLocalData *pLocalData;
    CObjectAttributes oa(NULL, lpThreadAttributes);
    bool fThreadDataStoredInObject = FALSE;

    pDummyThread = AllocTHREAD();
    if (NULL == pDummyThread)
    {
        palError = ERROR_OUTOFMEMORY;
        goto InternalCreateDummyThreadExit;
    }

    pDummyThread->m_fIsDummy = TRUE;

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otThread,
        &oa,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    palError = pobjThread->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    pLocalData->pThread = pDummyThread;
    pDataLock->ReleaseLock(pThread, TRUE);
    fThreadDataStoredInObject = TRUE;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjThread,
        &aotThread,
        0, // THREAD_ALL_ACCESS
        phThread,
        &pobjThreadRegistered
        );

    //
    // pobjThread is invalidated by the above call, so NULL
    // it out here
    //

    pobjThread = NULL;

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    //
    // Note the we do NOT store the registered object for the
    // thread w/in pDummyThread. Since this thread is not actually
    // executing that reference would never be released (and thus
    // the thread object would never be cleaned up...)
    //

    *ppDummyThread = pDummyThread;

InternalCreateDummyThreadExit:

    if (NULL != pobjThreadRegistered)
    {
        pobjThreadRegistered->ReleaseReference(pThread);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError
        && NULL != pDummyThread
        && !fThreadDataStoredInObject)
    {
        pDummyThread->ReleaseThreadReference();
    }

    return palError;
}